

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

BinsSelectExpr *
slang::ast::BinSelectWithFilterExpr::fromSyntax
          (BinSelectWithFilterExprSyntax *syntax,ASTContext *context)

{
  TempVarSymbol *pTVar1;
  bool bVar2;
  int iVar3;
  Compilation *this;
  BinsSelectExpressionSyntax *pBVar4;
  undefined4 extraout_var;
  Scope *pSVar5;
  Symbol *pSVar6;
  Type *pTVar7;
  TempVarSymbol *pTVar8;
  ExpressionSyntax *pEVar9;
  SyntaxNode *this_00;
  ExpressionPatternSyntax *pEVar10;
  BinSelectWithFilterExpr *pBVar11;
  socklen_t __len;
  bitmask<slang::ast::ASTFlags> local_b0;
  Expression *local_a8;
  Expression *matches;
  Expression *local_98;
  Expression *filter;
  IteratorSymbol *it;
  CoverpointSymbol *target;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *__range2;
  CoverCrossSymbol *cross;
  ASTContext iterCtx;
  BinsSelectExpr *expr;
  Compilation *comp;
  ASTContext *context_local;
  BinSelectWithFilterExprSyntax *syntax_local;
  
  this = ASTContext::getCompilation(context);
  pBVar4 = not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*(&syntax->expr);
  iVar3 = BinsSelectExpr::bind((int)pBVar4,(sockaddr *)context,__len);
  iterCtx.assertionInstance = (AssertionInstanceDetails *)CONCAT44(extraout_var,iVar3);
  memcpy(&cross,context,0x38);
  pSVar5 = not_null<const_slang::ast::Scope_*>::operator->(&context->scope);
  pSVar6 = Scope::asSymbol(pSVar5);
  pSVar5 = Symbol::getParentScope(pSVar6);
  pSVar6 = Scope::asSymbol(pSVar5);
  __range2 = (span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
             Symbol::as<slang::ast::CoverCrossSymbol>(pSVar6);
  __begin2 = (iterator)&((CoverCrossSymbol *)__range2)->targets;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
                      __begin2);
  target = (CoverpointSymbol *)
           nonstd::span_lite::
           span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL>::end
                     ((span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> *)
                      __begin2);
  for (; (CoverpointSymbol *)__end2 != target; __end2 = __end2 + 1) {
    it = (IteratorSymbol *)*__end2;
    pSVar5 = not_null<const_slang::ast::Scope_*>::operator*(&context->scope);
    pTVar8 = &it->super_TempVarSymbol;
    pTVar1 = &it->super_TempVarSymbol;
    pTVar7 = CoverpointSymbol::getType((CoverpointSymbol *)it);
    filter = (Expression *)
             BumpAllocator::
             emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::Type_const&>
                       (&this->super_BumpAllocator,pSVar5,
                        &(pTVar8->super_VariableSymbol).super_ValueSymbol.super_Symbol.name,
                        &(pTVar1->super_VariableSymbol).super_ValueSymbol.super_Symbol.location,
                        pTVar7);
    pTVar8 = std::exchange<slang::ast::TempVarSymbol_const*,slang::ast::IteratorSymbol*&>
                       ((TempVarSymbol **)&iterCtx.instanceOrProc,(IteratorSymbol **)&filter);
    *(TempVarSymbol **)(filter + 3) = pTVar8;
  }
  pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->filter);
  memset(&matches,0,8);
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&matches);
  local_98 = bindCovergroupExpr(pEVar9,(ASTContext *)&cross,(Type *)0x0,
                                (bitmask<slang::ast::ASTFlags>)matches);
  ASTContext::requireBooleanConvertible((ASTContext *)&cross,local_98);
  local_a8 = (Expression *)0x0;
  if (syntax->matchesClause != (MatchesClauseSyntax *)0x0) {
    this_00 = &not_null<slang::syntax::PatternSyntax_*>::operator->(&syntax->matchesClause->pattern)
               ->super_SyntaxNode;
    pEVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionPatternSyntax>(this_00);
    pEVar9 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pEVar10->expr);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_b0,AllowUnboundedLiteral);
    local_a8 = bindCovergroupExpr(pEVar9,context,(Type *)0x0,local_b0);
    bVar2 = Expression::bad(local_a8);
    if (!bVar2) {
      pTVar7 = not_null<const_slang::ast::Type_*>::operator->(&local_a8->type);
      bVar2 = Type::isUnbounded(pTVar7);
      if (!bVar2) {
        ASTContext::requireIntegral(context,local_a8);
      }
    }
  }
  pBVar11 = BumpAllocator::
            emplace<slang::ast::BinSelectWithFilterExpr,slang::ast::BinsSelectExpr_const&,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                      (&this->super_BumpAllocator,(BinsSelectExpr *)iterCtx.assertionInstance,
                       local_98,&local_a8);
  return &pBVar11->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& BinSelectWithFilterExpr::fromSyntax(const BinSelectWithFilterExprSyntax& syntax,
                                                    const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = bind(*syntax.expr, context);

    // Create the iterator variables for all of the parent cross items
    // and then bind the filter expression.
    ASTContext iterCtx = context;

    auto& cross = context.scope->asSymbol().getParentScope()->asSymbol().as<CoverCrossSymbol>();
    for (auto target : cross.targets) {
        auto it = comp.emplace<IteratorSymbol>(*context.scope, target->name, target->location,
                                               target->getType());
        it->nextTemp = std::exchange(iterCtx.firstTempVar, it);
    }

    auto& filter = bindCovergroupExpr(*syntax.filter, iterCtx);
    iterCtx.requireBooleanConvertible(filter);

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    return *comp.emplace<BinSelectWithFilterExpr>(expr, filter, matches);
}